

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O1

string_t __thiscall
duckdb::ReverseOperator::Operation<duckdb::string_t,duckdb::string_t>
          (ReverseOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 *puVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_t target;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  undefined4 uStack_8c;
  undefined4 *local_88;
  undefined8 local_80;
  char *local_78;
  GraphemeClusterIterator local_70 [32];
  GraphemeClusterIterator local_50 [32];
  
  local_78 = input.value._0_8_;
  uVar4 = (ulong)this & 0xffffffff;
  pcVar6 = local_78;
  if (uVar4 < 0xd) {
    pcVar6 = (char *)((long)&local_80 + 4);
  }
  local_80 = this;
  auVar10 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar4);
  local_88 = auVar10._8_8_;
  uStack_8c = auVar10._4_4_;
  puVar7 = local_88;
  if (auVar10._0_4_ < 0xd) {
    puVar7 = &uStack_8c;
  }
  bVar9 = uVar4 == 0;
  if ((!bVar9) && (cVar3 = *pcVar6, -1 < cVar3)) {
    pcVar5 = (char *)(uVar4 + (long)puVar7);
    uVar2 = 1;
    do {
      uVar8 = uVar2;
      pcVar5 = pcVar5 + -1;
      *pcVar5 = cVar3;
      if (uVar4 == uVar8) break;
      cVar3 = pcVar6[uVar8];
      uVar2 = uVar8 + 1;
    } while (-1 < cVar3);
    bVar9 = uVar4 <= uVar8;
  }
  if (!bVar9) {
    auVar11 = duckdb::Utf8Proc::GraphemeClusters(pcVar6,uVar4);
    duckdb::GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator
              (local_50,auVar11._0_8_,auVar11._8_8_);
    duckdb::GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator
              (local_70,(char *)0x0,0);
    cVar3 = duckdb::GraphemeIterator::GraphemeClusterIterator::operator!=(local_50,local_70);
    if (cVar3 != '\0') {
      do {
        auVar11 = duckdb::GraphemeIterator::GraphemeClusterIterator::operator*(local_50);
        memcpy((void *)((long)puVar7 + (uVar4 - auVar11._8_8_)),pcVar6 + auVar11._0_8_,
               auVar11._8_8_ - auVar11._0_8_);
        duckdb::GraphemeIterator::GraphemeClusterIterator::operator++(local_50);
        cVar3 = duckdb::GraphemeIterator::GraphemeClusterIterator::operator!=(local_50,local_70);
      } while (cVar3 != '\0');
    }
  }
  uVar4 = auVar10._0_8_ & 0xffffffff;
  if (uVar4 < 0xd) {
    memset((void *)((long)&uStack_8c + uVar4),0,0xc - uVar4);
  }
  else {
    uStack_8c = *local_88;
  }
  aVar1._4_1_ = (undefined1)uStack_8c;
  aVar1._5_1_ = uStack_8c._1_1_;
  aVar1._6_1_ = uStack_8c._2_1_;
  aVar1._7_1_ = uStack_8c._3_1_;
  aVar1.pointer.length = auVar10._0_4_;
  aVar1.pointer.ptr = (char *)local_88;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();

		auto target = StringVector::EmptyString(result, input_length);
		auto target_data = target.GetDataWriteable();
		if (!StrReverseASCII(input_data, input_length, target_data)) {
			StrReverseUnicode(input_data, input_length, target_data);
		}
		target.Finalize();
		return target;
	}